

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpRecursively(FunctionBody *dumpFunction)

{
  uint uVar1;
  FunctionInfo *this;
  FunctionBody *dumpFunction_00;
  undefined4 local_14;
  uint i;
  FunctionBody *dumpFunction_local;
  
  FunctionProxy::EnsureDeserialized((FunctionProxy *)dumpFunction);
  Dump(dumpFunction);
  local_14 = 0;
  while( true ) {
    uVar1 = ParseableFunctionInfo::GetNestedCount(&dumpFunction->super_ParseableFunctionInfo);
    if (uVar1 <= local_14) break;
    ParseableFunctionInfo::GetNestedFunctionForExecution
              (&dumpFunction->super_ParseableFunctionInfo,local_14);
    this = ParseableFunctionInfo::GetNestedFunc(&dumpFunction->super_ParseableFunctionInfo,local_14)
    ;
    dumpFunction_00 = FunctionInfo::GetFunctionBody(this);
    DumpRecursively(dumpFunction_00);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpRecursively(FunctionBody* dumpFunction)
    {
        dumpFunction->EnsureDeserialized();
        ByteCodeDumper::Dump(dumpFunction);
        for (uint i = 0; i < dumpFunction->GetNestedCount(); i ++)
        {
            dumpFunction->GetNestedFunctionForExecution(i);
            ByteCodeDumper::DumpRecursively(dumpFunction->GetNestedFunc(i)->GetFunctionBody());
        }
    }